

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

void __thiscall
Protocol::MQTT::V5::PropertiesView::dump(PropertiesView *this,FastString *out,int indent)

{
  bool bVar1;
  uint32 uVar2;
  undefined4 in_register_00000014;
  undefined8 uVar3;
  VisitorVariant visitor;
  String local_90;
  VisitorVariant local_80;
  
  MQTTStringPrintf((char *)&local_80,"%*sProperties with length ",
                   CONCAT44(in_register_00000014,indent),"");
  Bstrlib::String::operator+=(out,(String *)&local_80);
  Bstrlib::String::~String((String *)&local_80);
  Common::VBInt::dump(&this->length,out,0);
  uVar2 = Common::VBInt::operator_cast_to_unsigned_int(&this->length);
  if (uVar2 != 0) {
    local_80.type = '\a';
    local_80.propType = BadProperty;
    local_80.offset = 0;
    while( true ) {
      bVar1 = getProperty(this,&local_80);
      if (!bVar1) break;
      if (((byte)local_80.propType < 0x2b) &&
         ((0x16811f4f1U >> (ulong)(local_80.propType & 0x3f) & 1) == 0)) {
        uVar3 = *(undefined8 *)
                 (PrivateRegistry::getPropertyName(unsigned_char)::propertyMap +
                 (ulong)(byte)PrivateRegistry::invPropertyMap[local_80.propType & 0x3f] * 8);
      }
      else {
        uVar3 = 0;
      }
      MQTTStringPrintf((char *)&local_90,"%*sType %s\n",(ulong)(indent + 2),"",uVar3);
      Bstrlib::String::operator+=(out,&local_90);
      Bstrlib::String::~String(&local_90);
      VisitorVariant::dump(&local_80,out,indent + 4);
    }
  }
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*sProperties with length ", (int)indent, ""); length.dump(out, 0);
                    if (!(uint32)length) return;
                    VisitorVariant visitor;
                    while (getProperty(visitor))
                    {
                        out += MQTTStringPrintf("%*sType %s\n", indent+2, "", PrivateRegistry::getPropertyName(visitor.propertyType()));
                        visitor.dump(out, indent + 4);
                    }
                }